

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O3

pboolean p_uthread_set_priority(PUThread *thread,PUThreadPriority prio)

{
  int iVar1;
  pboolean pVar2;
  char *pcVar3;
  pint policy;
  pint native_prio;
  sched_param local_14;
  
  if (thread != (PUThread *)0x0) {
    iVar1 = pthread_getschedparam(thread->hdl,&policy,&local_14);
    if (iVar1 == 0) {
      pVar2 = pp_uthread_get_unix_priority(prio,&policy,&native_prio);
      if (pVar2 == 0) {
        pcVar3 = "PUThread::p_uthread_set_priority: pp_uthread_get_unix_priority() failed";
      }
      else {
        local_14.__sched_priority = native_prio;
        iVar1 = pthread_setschedparam(thread->hdl,policy,&local_14);
        if (iVar1 == 0) {
          (thread->base).prio = prio;
          return 1;
        }
        pcVar3 = "PUThread::p_uthread_set_priority: pthread_setschedparam() failed";
      }
    }
    else {
      pcVar3 = "PUThread::p_uthread_set_priority: pthread_getschedparam() failed";
    }
    printf("** Error: %s **\n",pcVar3);
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_uthread_set_priority (PUThread		*thread,
			PUThreadPriority	prio)
{
#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	struct sched_param	sched;
	pint			policy;
	pint			native_prio;
#endif

	if (P_UNLIKELY (thread == NULL))
		return FALSE;

#ifdef PLIBSYS_HAS_POSIX_SCHEDULING
	if (P_UNLIKELY (pthread_getschedparam (thread->hdl, &policy, &sched) != 0)) {
		P_ERROR ("PUThread::p_uthread_set_priority: pthread_getschedparam() failed");
		return FALSE;
	}

	if (P_UNLIKELY (pp_uthread_get_unix_priority (prio, &policy, &native_prio) == FALSE)) {
		P_ERROR ("PUThread::p_uthread_set_priority: pp_uthread_get_unix_priority() failed");
		return FALSE;
	}

	memset (&sched, 0, sizeof (sched));
	sched.sched_priority = native_prio;

	if (P_UNLIKELY (pthread_setschedparam (thread->hdl, policy, &sched) != 0)) {
		P_ERROR ("PUThread::p_uthread_set_priority: pthread_setschedparam() failed");
		return FALSE;
	}
#endif

	thread->base.prio = prio;
	return TRUE;
}